

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demoend_playground.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  inputs_type inputs;
  SM sm;
  
  std::operator<<((ostream *)&std::cout,"--- CD player demo playground ---\n");
  estl::state_machine<cdplayer>::state_machine(&sm);
  poVar1 = std::operator<<((ostream *)&std::cout,"states_count() : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"current state  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sm.state_);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"tv1.size()      : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  estl::state_machine<cdplayer>::test_transitions(&sm,&tv1,true);
  poVar1 = std::operator<<((ostream *)&std::cout,"sm.test_transitions(tv1):");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  inputs.event = no_btn_presed;
  sm.state_ = on;
  estl::state_machine<cdplayer>::execute_actions(&sm,&inputs);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  estl::state_machine<cdplayer>::~state_machine(&sm);
  return 0;
}

Assistant:

int main()
{
    cout << "--- CD player demo playground ---\n";
    SM sm;
    cout << "states_count() : " << sm.states_count() << "\n";
    cout << "current state  : " << sm.state_int() << "\n";
    cout << "tv1.size()      : " << tv1.size() << "\n";
    const auto all_ok = sm.test_transitions(tv1, true);
    cout << "sm.test_transitions(tv1):" << all_ok << "\n";


    SM::inputs_type inputs;
    sm.state_set(state_type::on);
    sm.execute_actions(inputs);


//    cout << sm.outputs().debug_str() << endl;

    cout << endl;
    return 0;
}